

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.h
# Opt level: O0

bool llvm::detail::to_float<float>(Twine *T,float *Num,_func_float_char_ptr_char_ptr_ptr *StrTo)

{
  char cVar1;
  char *pcVar2;
  float fVar3;
  StringRef SVar4;
  char *pcStack_80;
  float Temp;
  char *End;
  undefined1 local_68 [8];
  StringRef S;
  SmallString<32U> Storage;
  _func_float_char_ptr_char_ptr_ptr *StrTo_local;
  float *Num_local;
  Twine *T_local;
  
  SmallString<32U>::SmallString((SmallString<32U> *)&S.Length);
  SVar4 = Twine::toNullTerminatedStringRef(T,(SmallVectorImpl<char> *)&S.Length);
  S.Data = (char *)SVar4.Length;
  local_68 = (undefined1  [8])SVar4.Data;
  pcVar2 = StringRef::data((StringRef *)local_68);
  fVar3 = (*StrTo)(pcVar2,&stack0xffffffffffffff80);
  cVar1 = *pcStack_80;
  if (cVar1 == '\0') {
    *Num = fVar3;
  }
  SmallString<32U>::~SmallString((SmallString<32U> *)&S.Length);
  return cVar1 == '\0';
}

Assistant:

inline bool to_float(const Twine &T, N &Num, N (*StrTo)(const char *, char **)) {
  SmallString<32> Storage;
  StringRef S = T.toNullTerminatedStringRef(Storage);
  char *End;
  N Temp = StrTo(S.data(), &End);
  if (*End != '\0')
    return false;
  Num = Temp;
  return true;
}